

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O2

QRect qvariant_cast<QRect>(QVariant *v)

{
  PrivateShared *pPVar1;
  ulong uVar2;
  QRect QVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QMetaType local_38;
  QMetaType local_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  Representation RStack_1c;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QRect>::metaType;
  local_38.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(v->d).field_0x18 & 0xfffffffffffffffc);
  bVar4 = comparesEqual(&local_38,&local_30);
  if (bVar4) {
    if (((v->d).field_0x18 & 1) != 0) {
      pPVar1 = (v->d).data.shared;
      v = (QVariant *)
          ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                  super___atomic_base<int> + (long)pPVar1->offset);
    }
    local_28 = *(undefined4 *)&(v->d).data;
    uStack_24 = *(undefined4 *)((long)&(v->d).data + 4);
    uStack_20 = *(undefined4 *)((long)&(v->d).data + 8);
    RStack_1c.m_i = *(int *)((long)&(v->d).data + 0xc);
  }
  else {
    local_28 = 0;
    uStack_24 = 0;
    uStack_20 = 0xffffffff;
    RStack_1c.m_i = -1;
    uVar2 = *(ulong *)&(v->d).field_0x18;
    if ((uVar2 & 1) != 0) {
      pPVar1 = (v->d).data.shared;
      v = (QVariant *)
          ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                  super___atomic_base<int> + (long)pPVar1->offset);
    }
    QMetaType::convert((QMetaTypeInterface *)(uVar2 & 0xfffffffffffffffc),v,local_30,&local_28);
  }
  QVar3.y1.m_i = uStack_24;
  QVar3.x1.m_i = local_28;
  QVar3.x2.m_i = uStack_20;
  QVar3.y2.m_i = RStack_1c.m_i;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}